

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,ZeroCopyOutputStream *output)

{
  bool bVar1;
  TextGenerator *in_RDI;
  TextGenerator generator;
  TextGenerator *in_stack_000001c0;
  UnknownFieldSet *in_stack_000001c8;
  Printer *in_stack_000001d0;
  TextGenerator *in_stack_ffffffffffffffb0;
  TextGenerator local_40;
  
  TextGenerator::TextGenerator
            (in_stack_ffffffffffffffb0,(ZeroCopyOutputStream *)&local_40,
             (int)((ulong)in_RDI >> 0x20));
  PrintUnknownFields(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  bVar1 = TextGenerator::failed(&local_40);
  TextGenerator::~TextGenerator(in_RDI);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields,
    io::ZeroCopyOutputStream* output) const {
  TextGenerator generator(output, initial_indent_level_);

  PrintUnknownFields(unknown_fields, &generator);

  // Output false if the generator failed internally.
  return !generator.failed();
}